

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O0

void __thiscall
OpenMD::GofAngle2::collectHistogram(GofAngle2 *this,StuntDouble *sd1,StuntDouble *sd2)

{
  bool bVar1;
  undefined8 uVar2;
  reference this_00;
  reference pvVar3;
  Atom *in_RDX;
  Atom *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  double dVar4;
  double dVar5;
  double dVar6;
  int angleBin2;
  int angleBin1;
  RealType halfBin;
  RealType cosAngle2;
  RealType cosAngle1;
  Vector3d dipole2;
  Vector3d dipole1;
  MultipoleAdapter ma2;
  MultipoleAdapter ma1;
  AtomType *atype2;
  AtomType *atype1;
  Vector3d r12;
  Vector3d pos2;
  Vector3d pos1;
  bool usePeriodicBoundaryConditions_;
  Vector<double,_3U> *in_stack_fffffffffffffd08;
  StuntDouble *in_stack_fffffffffffffd10;
  Vector<double,_3U> *this_01;
  StuntDouble *in_stack_fffffffffffffd18;
  Vector<double,_3U> *v2;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *in_stack_fffffffffffffd30;
  SquareMatrix3<double> *in_stack_fffffffffffffd48;
  MultipoleAdapter *in_stack_fffffffffffffd78;
  Vector3d *in_stack_fffffffffffffd88;
  Snapshot *in_stack_fffffffffffffd90;
  Vector<double,_3U> local_1d0 [8];
  Vector<double,_3U> local_110;
  Vector<double,_3U> local_f8;
  string local_e0 [32];
  string local_c0 [32];
  MultipoleAdapter local_a0;
  MultipoleAdapter local_98;
  AtomType *local_90;
  AtomType *local_88;
  Vector<double,_3U> local_68 [3];
  byte local_19;
  Atom *local_18;
  Atom *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  SimInfo::getSimParams((SimInfo *)in_RDI->data_[0][1]);
  local_19 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x14bead);
  if (local_10 != local_18) {
    StuntDouble::getPos(in_stack_fffffffffffffd18);
    StuntDouble::getPos(in_stack_fffffffffffffd18);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd18,
                      (Vector<double,_3U> *)in_stack_fffffffffffffd10);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08)
    ;
    if ((local_19 & 1) != 0) {
      Snapshot::wrapVector(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    }
    local_88 = Atom::getAtomType(local_10);
    local_90 = Atom::getAtomType(local_18);
    MultipoleAdapter::MultipoleAdapter(&local_98,local_88);
    MultipoleAdapter::MultipoleAdapter(&local_a0,local_90);
    bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffd10);
    if (!bVar1) {
      (*(local_10->super_StuntDouble)._vptr_StuntDouble[7])(local_c0);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n",
               uVar2);
      std::__cxx11::string::~string(local_c0);
      painCave.isFatal = 1;
      simError();
    }
    bVar1 = StuntDouble::isDirectional(in_stack_fffffffffffffd10);
    if (!bVar1) {
      (*(local_18->super_StuntDouble)._vptr_StuntDouble[7])(local_e0);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n",
               uVar2);
      std::__cxx11::string::~string(local_e0);
      painCave.isFatal = 1;
      simError();
    }
    Vector3<double>::Vector3((Vector3<double> *)0x14c095);
    Vector3<double>::Vector3((Vector3<double> *)0x14c0a2);
    bVar1 = MultipoleAdapter::isDipole(in_stack_fffffffffffffd78);
    if (bVar1) {
      StuntDouble::getDipole(in_stack_fffffffffffffd18);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd10,
                 (Vector3<double> *)in_stack_fffffffffffffd08);
    }
    else {
      in_stack_fffffffffffffd30 = local_1d0;
      StuntDouble::getA(in_stack_fffffffffffffd18);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffd48);
      OpenMD::operator*(in_RDI,in_stack_fffffffffffffd30);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd18,
                 (Vector<double,_3U> *)in_stack_fffffffffffffd10);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14c154);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14c161);
    }
    bVar1 = MultipoleAdapter::isDipole(in_stack_fffffffffffffd78);
    if (bVar1) {
      StuntDouble::getDipole(in_stack_fffffffffffffd18);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd10,
                 (Vector3<double> *)in_stack_fffffffffffffd08);
    }
    else {
      StuntDouble::getA(in_stack_fffffffffffffd18);
      SquareMatrix3<double>::transpose(in_stack_fffffffffffffd48);
      OpenMD::operator*(in_RDI,in_stack_fffffffffffffd30);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd18,
                 (Vector<double,_3U> *)in_stack_fffffffffffffd10);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14c25b);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14c265);
    }
    this_01 = local_68;
    Vector<double,_3U>::normalize(this_01);
    v2 = &local_f8;
    Vector<double,_3U>::normalize(this_01);
    v1 = &local_110;
    Vector<double,_3U>::normalize(this_01);
    dVar4 = dot<double,3u>(v1,v2);
    dVar5 = dot<double,3u>(v1,v2);
    dVar6 = (double)(*(int *)((long)in_RDI->data_[2] + 4) - 1) * 0.5;
    this_00 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI[0x4e].data_[0] + 1),(long)(int)(dVar6 * (dVar4 + 1.0)));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (this_00,(long)(int)(dVar6 * (dVar5 + 1.0)));
    *pvVar3 = *pvVar3 + 1;
    *(int *)(in_RDI[0x4e].data_[2] + 1) = *(int *)(in_RDI[0x4e].data_[2] + 1) + 1;
  }
  return;
}

Assistant:

void GofAngle2::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (sd1 == sd2) { return; }

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos1 - pos2;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    Vector3d dipole1, dipole2;
    if (ma1.isDipole())
      dipole1 = sd1->getDipole();
    else
      dipole1 = sd1->getA().transpose() * V3Z;

    if (ma2.isDipole())
      dipole2 = sd2->getDipole();
    else
      dipole2 = sd2->getA().transpose() * V3Z;

    r12.normalize();
    dipole1.normalize();
    dipole2.normalize();

    RealType cosAngle1 = dot(r12, dipole1);
    RealType cosAngle2 = dot(dipole1, dipole2);

    RealType halfBin = (nBins_ - 1) * 0.5;
    int angleBin1    = int(halfBin * (cosAngle1 + 1.0));
    int angleBin2    = int(halfBin * (cosAngle2 + 1.0));

    ++histogram_[angleBin1][angleBin2];
    ++npairs_;
  }